

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::internalLoadAllDisplayNames(TimeZoneNamesImpl *this,UErrorCode *status)

{
  UHashtable *hash;
  int iVar1;
  StringEnumeration *pSVar2;
  undefined4 extraout_var;
  char16_t *key;
  void *pvVar3;
  ZoneStringsLoader loader;
  UnicodeString copy;
  UnicodeString *that;
  
  if (this->fNamesFullyLoaded != '\0') {
    return;
  }
  this->fNamesFullyLoaded = '\x01';
  ZoneStringsLoader::ZoneStringsLoader(&loader,this,status);
  ZoneStringsLoader::load(&loader,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pSVar2 = TimeZone::createTimeZoneIDEnumeration
                       (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      while( true ) {
        iVar1 = (*(pSVar2->super_UObject)._vptr_UObject[7])(pSVar2,status);
        that = (UnicodeString *)CONCAT44(extraout_var,iVar1);
        if ((that == (UnicodeString *)0x0) || (U_ZERO_ERROR < *status)) break;
        UnicodeString::UnicodeString(&copy,that);
        hash = this->fTZNamesMap;
        key = UnicodeString::getTerminatedBuffer(&copy);
        pvVar3 = uhash_get_63(hash,key);
        if (pvVar3 == (void *)0x0) {
          loadStrings(this,that,status);
        }
        UnicodeString::~UnicodeString(&copy);
      }
    }
    else if (pSVar2 == (StringEnumeration *)0x0) goto LAB_00212242;
    (*(pSVar2->super_UObject)._vptr_UObject[1])(pSVar2);
  }
LAB_00212242:
  ZoneStringsLoader::~ZoneStringsLoader(&loader);
  return;
}

Assistant:

void TimeZoneNamesImpl::internalLoadAllDisplayNames(UErrorCode& status) {
    if (!fNamesFullyLoaded) {
        fNamesFullyLoaded = TRUE;

        ZoneStringsLoader loader(*this, status);
        loader.load(status);
        if (U_FAILURE(status)) { return; }

        const UnicodeString *id;

        // load strings for all zones
        StringEnumeration *tzIDs = TimeZone::createTimeZoneIDEnumeration(
            UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
        if (U_SUCCESS(status)) {
            while ((id = tzIDs->snext(status)) != NULL) {
                if (U_FAILURE(status)) {
                    break;
                }
                UnicodeString copy(*id);
                void* value = uhash_get(fTZNamesMap, copy.getTerminatedBuffer());
                if (value == NULL) {
                    // loadStrings also loads related metazone strings
                    loadStrings(*id, status);
                }
            }
        }
        if (tzIDs != NULL) {
            delete tzIDs;
        }
    }
}